

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateStackScriptFunctionInit
          (Lowerer *this,StackSym *stackSym,FunctionInfoPtrPtr nestedInfo)

{
  Func *this_00;
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *insertBeforeInstr_00;
  SymOpnd *pSVar5;
  ThreadContextInfo *this_01;
  intptr_t address;
  AddrOpnd *envOpnd;
  undefined1 local_50 [8];
  AutoReuseOpnd autoReuseAddressOpnd;
  RegOpnd *addressOpnd;
  Instr *insertBeforeInstr;
  Func *func;
  FunctionInfoPtrPtr nestedInfo_local;
  StackSym *stackSym_local;
  Lowerer *this_local;
  
  this_00 = this->m_func;
  bVar3 = Func::HasAnyStackNestedFunc(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x19dd,"(func->HasAnyStackNestedFunc())","func->HasAnyStackNestedFunc()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->nextStackFunctionOpnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x19de,"(nextStackFunctionOpnd)","nextStackFunctionOpnd");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  insertBeforeInstr_00 = Func::GetFunctionEntryInsertionPoint(this_00);
  autoReuseAddressOpnd._16_8_ = IR::RegOpnd::New(TyUint64,this_00);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_50,(Opnd *)autoReuseAddressOpnd._16_8_,this_00,true);
  uVar2 = autoReuseAddressOpnd._16_8_;
  pSVar5 = IR::SymOpnd::New(&stackSym->super_Sym,TyUint64,this_00);
  InsertLea((RegOpnd *)uVar2,&pSVar5->super_Opnd,insertBeforeInstr_00);
  uVar2 = autoReuseAddressOpnd._16_8_;
  this_01 = Func::GetThreadContextInfo(this_00);
  address = ThreadContextInfo::GetNullFrameDisplayAddr(this_01);
  envOpnd = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this_00,false,(Var)0x0);
  GenerateStackScriptFunctionInit
            (this,(RegOpnd *)uVar2,nestedInfo,&envOpnd->super_Opnd,insertBeforeInstr_00);
  InsertMove(this->nextStackFunctionOpnd,(Opnd *)autoReuseAddressOpnd._16_8_,insertBeforeInstr_00,
             true);
  pSVar5 = IR::SymOpnd::New(&stackSym->super_Sym,0x50,TyUint64,this_00);
  this->nextStackFunctionOpnd = &pSVar5->super_Opnd;
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_50);
  return;
}

Assistant:

void
Lowerer::GenerateStackScriptFunctionInit(StackSym * stackSym, Js::FunctionInfoPtrPtr nestedInfo)
{
    Func * func = this->m_func;
    Assert(func->HasAnyStackNestedFunc());
    Assert(nextStackFunctionOpnd);

    IR::Instr * insertBeforeInstr = func->GetFunctionEntryInsertionPoint();

    IR::RegOpnd * addressOpnd = IR::RegOpnd::New(TyMachPtr, func);
    const IR::AutoReuseOpnd autoReuseAddressOpnd(addressOpnd, func);
    InsertLea(addressOpnd, IR::SymOpnd::New(stackSym, TyMachPtr, func), insertBeforeInstr);

    // Currently we don't initialize the environment until we actually allocate the function, we also
    // walk the list of stack function when we need to box them. so we should use initialize it to NullFrameDisplay
    GenerateStackScriptFunctionInit(addressOpnd, nestedInfo,
        IR::AddrOpnd::New(func->GetThreadContextInfo()->GetNullFrameDisplayAddr(), IR::AddrOpndKindDynamicMisc, func), insertBeforeInstr);

    // Establish the next link
    InsertMove(nextStackFunctionOpnd, addressOpnd, insertBeforeInstr);
    this->nextStackFunctionOpnd = IR::SymOpnd::New(stackSym, sizeof(Js::StackScriptFunction), TyMachPtr, func);
}